

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::not_equals1_msg(void)

{
  allocator local_a1;
  int local_a0;
  int local_9c;
  string msg;
  string expected;
  
  expected._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  expected._M_string_length._0_4_ = 0x84;
  std::__cxx11::string::string((string *)&msg,"Extra message",&local_a1);
  local_a0 = 1;
  local_9c = local_a0;
  UnitTests::Assert::NotEquals<int,int>((Assert *)&expected,&msg,&local_a0,&local_9c);
  std::__cxx11::string::~string((string *)&msg);
  msg._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  msg._M_string_length._0_4_ = 0x85;
  UnitTests::Assert::Fail((Assert *)&msg);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }